

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmconsol.cpp
# Opt level: O2

int __thiscall CVmConsole::close_command_log(CVmConsole *this)

{
  undefined8 uVar1;
  void *pvVar2;
  undefined8 *puVar3;
  long *plVar4;
  int in_ESI;
  err_frame_t err_cur__;
  uint local_f0 [2];
  undefined8 local_e8;
  void *local_e0;
  __jmp_buf_tag local_d8;
  
  if (this->command_fp_ != (CVmDataSource *)0x0) {
    (*this->command_fp_->_vptr_CVmDataSource[1])();
    puVar3 = (undefined8 *)_ZTW11G_err_frame();
    local_e8 = *puVar3;
    plVar4 = (long *)_ZTW11G_err_frame();
    *plVar4 = (long)local_f0;
    local_f0[0] = _setjmp(&local_d8);
    if (local_f0[0] == 0) {
      CVmNetFile::close(this->command_nf_,in_ESI);
    }
    uVar1 = local_e8;
    if (local_f0[0] == 1) {
      local_f0[0] = 2;
    }
    puVar3 = (undefined8 *)_ZTW11G_err_frame();
    *puVar3 = uVar1;
    if ((local_f0[0] & 0x4001) != 0) {
      puVar3 = (undefined8 *)_ZTW11G_err_frame();
      if ((*(byte *)*puVar3 & 2) != 0) {
        plVar4 = (long *)_ZTW11G_err_frame();
        free(*(void **)(*plVar4 + 0x10));
      }
      pvVar2 = local_e0;
      plVar4 = (long *)_ZTW11G_err_frame();
      *(void **)(*plVar4 + 0x10) = pvVar2;
      err_rethrow();
    }
    if ((local_f0[0] & 2) != 0) {
      free(local_e0);
    }
    this->command_fp_ = (CVmDataSource *)0x0;
  }
  if (this->command_glob_ != (vm_globalvar_t *)0x0) {
    (this->command_glob_->val).typ = VM_NIL;
  }
  return 0;
}

Assistant:

int CVmConsole::close_command_log(VMG0_)
{
    /* if there's a command log file, close it */
    if (command_fp_ != 0)
    {
        /* close the file */
        delete command_fp_;

        /* close the network file */
        err_try
        {
            command_nf_->close(vmg0_);
        }
        err_catch_disc
        {
            /* 
             *   ignore any errors - our interface doesn't give us any
             *   meaningful way to return error information
             */
        }
        err_end;

        /* forget the file */
        command_fp_ = 0;
    }